

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

SVGPatternAttributes * __thiscall
lunasvg::SVGPatternElement::collectPatternAttributes
          (SVGPatternAttributes *__return_storage_ptr__,SVGPatternElement *this)

{
  SVGPatternElement *pSVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  char cVar4;
  SVGPatternElement *pSVar5;
  _Base_ptr p_Var6;
  SVGPatternElement *pSVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  SVGPatternElement *pSVar10;
  _List_node_base *p_Var11;
  SVGNodeList *pSVar12;
  SVGPatternElement *pSVar13;
  SVGPatternElement *pSVar14;
  SVGPatternElement *current;
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  processedPatterns;
  SVGPatternElement *local_a0;
  SVGPatternElement *local_98;
  SVGPatternElement *local_90;
  SVGPatternElement *local_88;
  SVGPatternElement *local_80;
  SVGPatternElement *local_78;
  SVGPatternElement *local_70;
  SVGPatternElement *local_68;
  _Rb_tree<const_lunasvg::SVGPatternElement_*,_const_lunasvg::SVGPatternElement_*,_std::_Identity<const_lunasvg::SVGPatternElement_*>,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  local_60;
  
  __return_storage_ptr__->m_preserveAspectRatio = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentElement = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternContentUnits = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_viewBox = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternTransform = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_patternUnits = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_width = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_height = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_x = (SVGPatternElement *)0x0;
  __return_storage_ptr__->m_y = (SVGPatternElement *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pSVar10 = (SVGPatternElement *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = (SVGPatternElement *)0x0;
  local_90 = (SVGPatternElement *)0x0;
  local_88 = (SVGPatternElement *)0x0;
  local_80 = (SVGPatternElement *)0x0;
  local_78 = (SVGPatternElement *)0x0;
  local_70 = (SVGPatternElement *)0x0;
  pSVar14 = (SVGPatternElement *)0x0;
  pSVar7 = (SVGPatternElement *)0x0;
  pSVar13 = (SVGPatternElement *)0x0;
  local_a0 = this;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    do {
      do {
        if (pSVar13 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,X);
          if (bVar3) {
            __return_storage_ptr__->m_x = local_a0;
            pSVar13 = local_a0;
          }
          else {
            pSVar13 = (SVGPatternElement *)0x0;
          }
        }
        if (pSVar7 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,Y);
          if (bVar3) {
            __return_storage_ptr__->m_y = local_a0;
            pSVar7 = local_a0;
          }
          else {
            pSVar7 = (SVGPatternElement *)0x0;
          }
        }
        if (pSVar14 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,Width);
          if (bVar3) {
            __return_storage_ptr__->m_width = local_a0;
            pSVar14 = local_a0;
          }
          else {
            pSVar14 = (SVGPatternElement *)0x0;
          }
        }
        if (local_70 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,Height);
          if (bVar3) {
            __return_storage_ptr__->m_height = local_a0;
            local_70 = local_a0;
          }
          else {
            local_70 = (SVGPatternElement *)0x0;
          }
        }
        if (local_78 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,PatternTransform);
          if (bVar3) {
            __return_storage_ptr__->m_patternTransform = local_a0;
            local_78 = local_a0;
          }
          else {
            local_78 = (SVGPatternElement *)0x0;
          }
        }
        if (local_80 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,PatternUnits);
          if (bVar3) {
            __return_storage_ptr__->m_patternUnits = local_a0;
            local_80 = local_a0;
          }
          else {
            local_80 = (SVGPatternElement *)0x0;
          }
        }
        if (local_88 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,PatternContentUnits);
          if (bVar3) {
            __return_storage_ptr__->m_patternContentUnits = local_a0;
            local_88 = local_a0;
          }
          else {
            local_88 = (SVGPatternElement *)0x0;
          }
        }
        if (local_90 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,ViewBox);
          if (bVar3) {
            __return_storage_ptr__->m_viewBox = local_a0;
            local_90 = local_a0;
          }
          else {
            local_90 = (SVGPatternElement *)0x0;
          }
        }
        if (local_98 == (SVGPatternElement *)0x0) {
          bVar3 = SVGElement::hasAttribute((SVGElement *)local_a0,PreserveAspectRatio);
          if (bVar3) {
            __return_storage_ptr__->m_preserveAspectRatio = local_a0;
            local_98 = local_a0;
          }
          else {
            local_98 = (SVGPatternElement *)0x0;
          }
        }
        if (pSVar10 == (SVGPatternElement *)0x0) {
          pSVar12 = &(local_a0->super_SVGPaintElement).super_SVGElement.m_children;
          p_Var11 = (_List_node_base *)pSVar12;
          do {
            p_Var11 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                         *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var11 == (_List_node_base *)pSVar12) {
              pSVar10 = (SVGPatternElement *)0x0;
              goto LAB_00118762;
            }
            cVar4 = (**(code **)(*(long *)p_Var11[1]._M_next + 0x18))();
          } while (cVar4 == '\0');
          __return_storage_ptr__->m_patternContentElement = local_a0;
          pSVar10 = local_a0;
        }
LAB_00118762:
        pSVar5 = (SVGPatternElement *)
                 SVGURIReference::getTargetElement
                           (&local_a0->super_SVGURIReference,
                            (local_68->super_SVGPaintElement).super_SVGElement.super_SVGNode.
                            m_document);
        if ((pSVar5 == (SVGPatternElement *)0x0) ||
           ((pSVar5->super_SVGPaintElement).super_SVGElement.m_id != Pattern)) goto LAB_001187f0;
        std::
        _Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
        ::_M_insert_unique<lunasvg::SVGPatternElement_const*const&>
                  ((_Rb_tree<lunasvg::SVGPatternElement_const*,lunasvg::SVGPatternElement_const*,std::_Identity<lunasvg::SVGPatternElement_const*>,std::less<lunasvg::SVGPatternElement_const*>,std::allocator<lunasvg::SVGPatternElement_const*>>
                    *)&local_60,&local_a0);
        local_a0 = pSVar5;
      } while (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0);
      p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &local_60._M_impl.super__Rb_tree_header._M_header;
      do {
        p_Var8 = p_Var9;
        p_Var6 = p_Var2;
        pSVar1 = *(SVGPatternElement **)(p_Var6 + 1);
        p_Var9 = p_Var6;
        if (pSVar1 < pSVar5) {
          p_Var9 = p_Var8;
        }
        p_Var2 = (&p_Var6->_M_left)[pSVar1 < pSVar5];
      } while ((&p_Var6->_M_left)[pSVar1 < pSVar5] != (_Base_ptr)0x0);
    } while ((_Rb_tree_header *)p_Var9 == &local_60._M_impl.super__Rb_tree_header);
    if (pSVar1 < pSVar5) {
      p_Var6 = p_Var8;
    }
  } while (pSVar5 < *(SVGPatternElement **)(p_Var6 + 1));
LAB_001187f0:
  SVGPatternAttributes::setDefaultValues(__return_storage_ptr__,local_68);
  std::
  _Rb_tree<const_lunasvg::SVGPatternElement_*,_const_lunasvg::SVGPatternElement_*,_std::_Identity<const_lunasvg::SVGPatternElement_*>,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SVGPatternAttributes SVGPatternElement::collectPatternAttributes() const
{
    SVGPatternAttributes attributes;
    std::set<const SVGPatternElement*> processedPatterns;
    const SVGPatternElement* current = this;
    while(true) {
        if(!attributes.hasX() && current->hasAttribute(PropertyID::X))
            attributes.setX(current);
        if(!attributes.hasY() && current->hasAttribute(PropertyID::Y))
            attributes.setY(current);
        if(!attributes.hasWidth() && current->hasAttribute(PropertyID::Width))
            attributes.setWidth(current);
        if(!attributes.hasHeight() && current->hasAttribute(PropertyID::Height))
            attributes.setHeight(current);
        if(!attributes.hasPatternTransform() && current->hasAttribute(PropertyID::PatternTransform))
            attributes.setPatternTransform(current);
        if(!attributes.hasPatternUnits() && current->hasAttribute(PropertyID::PatternUnits))
            attributes.setPatternUnits(current);
        if(!attributes.hasPatternContentUnits() && current->hasAttribute(PropertyID::PatternContentUnits))
            attributes.setPatternContentUnits(current);
        if(!attributes.hasViewBox() && current->hasAttribute(PropertyID::ViewBox))
            attributes.setViewBox(current);
        if(!attributes.hasPreserveAspectRatio() && current->hasAttribute(PropertyID::PreserveAspectRatio))
            attributes.setPreserveAspectRatio(current);
        if(!attributes.hasPatternContentElement()) {
            for(const auto& child : current->children()) {
                if(child->isElement()) {
                    attributes.setPatternContentElement(current);
                    break;
                }
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || targetElement->id() != ElementID::Pattern)
            break;
        processedPatterns.insert(current);
        current = static_cast<const SVGPatternElement*>(targetElement);
        if(processedPatterns.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}